

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBHub.cpp
# Opt level: O0

bool __thiscall
ADSBHubConnection::StreamProcessDataSBS(ADSBHubConnection *this,size_t num,char *buffer)

{
  bool bVar1;
  ulong uVar2;
  void *in_RDX;
  size_t in_RSI;
  long *in_RDI;
  size_t len;
  char *pEnd;
  char *pStart;
  ADSBHubConnection *in_stack_00000280;
  char *in_stack_000004a8;
  char *in_stack_000004b0;
  ADSBHubConnection *in_stack_000004b8;
  void *local_30;
  void *local_28;
  size_t local_18;
  
  local_30 = memchr(in_RDX,10,in_RSI);
  local_28 = in_RDX;
  local_18 = in_RSI;
  do {
    if (local_30 == (void *)0x0) {
      if (local_18 == 0) {
        ProcessPlaneData(in_stack_00000280);
      }
      else {
        std::__cxx11::string::append((char *)(in_RDI + 0x50),(ulong)local_28);
      }
      (**(code **)(*in_RDI + 0x48))();
      return true;
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::append((char *)(in_RDI + 0x50),(ulong)local_28);
      std::__cxx11::string::c_str();
      std::__cxx11::string::c_str();
      std::__cxx11::string::length();
      bVar1 = StreamProcessDataSBSLine(in_stack_000004b8,in_stack_000004b0,in_stack_000004a8);
      if ((!bVar1) && (uVar2 = (**(code **)(*in_RDI + 0x40))(), (uVar2 & 1) == 0)) {
        std::__cxx11::string::clear();
        return false;
      }
      std::__cxx11::string::clear();
    }
    else {
      bVar1 = StreamProcessDataSBSLine(in_stack_000004b8,in_stack_000004b0,in_stack_000004a8);
      if ((!bVar1) && (uVar2 = (**(code **)(*in_RDI + 0x40))(), (uVar2 & 1) == 0)) {
        return false;
      }
    }
    local_18 = local_18 - ((long)local_30 + (1 - (long)local_28));
    local_28 = (void *)((long)local_30 + 1);
    local_30 = memchr(local_28,10,local_18);
  } while( true );
}

Assistant:

bool ADSBHubConnection::StreamProcessDataSBS (size_t num, const char* buffer)
{
    // reading pointer into buffer: beginning and end of a line
    const char* pStart = buffer;            // beginning of a line
    const char* pEnd = (const char*)std::memchr(pStart, '\n', num);
    
    // Loop for all complete lines found
    while (pEnd)
    {
        const size_t len = size_t(pEnd-pStart +1);
        
        // Any left overs from previous message?
        if (!lnLeftOver.empty()) {
            lnLeftOver.append(pStart, len);
            if (!StreamProcessDataSBSLine(lnLeftOver.c_str(), lnLeftOver.c_str() + lnLeftOver.length() -1) &&
                !IncErrCnt())
            {
                lnLeftOver.clear();     // too many errors, bail
                return false;
            }
            lnLeftOver.clear();         // left overs now processed
        }
        // Process full line directly from received data
        else {
            if (!StreamProcessDataSBSLine(pStart, pEnd) &&
                !IncErrCnt())
                return false;           // too many errors, bail
        }
        // Advance to next line in the data
        num -= len;                     // have processed `len` chars
        pStart = pEnd + 1;              // next line starts _after_ the CR
        pEnd = (const char*)std::memchr(pStart, '\n', num);
    }
    
    // Any left overs? Save for later
    if (num > 0)
        lnLeftOver.append(pStart, num);
    else
        // If the entire network message _exactly_ ended with a full line then assume we're done completely and also process that last plane data
        ProcessPlaneData();
    
    // Success
    DecErrCnt();                        // reduce error counter with each fully processed message
    return true;
}